

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

void ncnn::qsort_descent_inplace<ncnn::BBoxRect>
               (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *datas,
               vector<float,_std::allocator<float>_> *scores,int left,int right)

{
  float fVar1;
  reference pvVar2;
  reference __a;
  reference __b;
  reference __b_00;
  int in_ECX;
  int in_EDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *in_RDI;
  float p;
  int j;
  int i;
  int iVar3;
  int iVar4;
  
  iVar3 = in_ECX;
  iVar4 = in_EDX;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     (in_RSI,(long)((in_EDX + in_ECX) / 2));
  fVar1 = *pvVar2;
  while (in_EDX <= in_ECX) {
    while (pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)in_EDX),
          fVar1 < *pvVar2) {
      in_EDX = in_EDX + 1;
    }
    while (pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)in_ECX),
          *pvVar2 < fVar1) {
      in_ECX = in_ECX + -1;
    }
    if (in_EDX <= in_ECX) {
      __a = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                      (in_RDI,(long)in_EDX);
      __b = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                      (in_RDI,(long)in_ECX);
      std::swap<ncnn::BBoxRect>(__a,__b);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)in_EDX);
      __b_00 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)in_ECX);
      std::swap<float>(pvVar2,__b_00);
      in_EDX = in_EDX + 1;
      in_ECX = in_ECX + -1;
    }
  }
  if (iVar4 < in_ECX) {
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)in_RSI,
               (vector<float,_std::allocator<float>_> *)CONCAT44(iVar4,iVar3),in_EDX,in_ECX);
  }
  if (in_EDX < iVar3) {
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)in_RSI,
               (vector<float,_std::allocator<float>_> *)CONCAT44(iVar4,iVar3),in_EDX,in_ECX);
  }
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<T>& datas, std::vector<float>& scores, int left, int right)
{
    int i = left;
    int j = right;
    float p = scores[(left + right) / 2];

    while (i <= j)
    {
        while (scores[i] > p)
            i++;

        while (scores[j] < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(datas[i], datas[j]);
            std::swap(scores[i], scores[j]);

            i++;
            j--;
        }
    }

    if (left < j)
        qsort_descent_inplace(datas, scores, left, j);

    if (i < right)
        qsort_descent_inplace(datas, scores, i, right);
}